

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::check_id(Parser *this)

{
  bool bVar1;
  reference pvVar2;
  ID *this_00;
  Exception *this_01;
  undefined1 local_30 [40];
  Parser *this_local;
  
  local_30._32_8_ = this;
  pvVar2 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[]
                     (this->ID_tables_vec,(long)this->c_add_val);
  this_00 = ID_table_t::operator[](pvVar2,this->c_val);
  bVar1 = ID::get_declared(this_00);
  if (!bVar1) {
    this_01 = (Exception *)__cxa_allocate_exception(0x30);
    pvVar2 = std::vector<ID_table_t,_std::allocator<ID_table_t>_>::operator[]
                       (this->ID_tables_vec,(long)this->c_add_val);
    ID_table_t::operator[](pvVar2,this->c_val);
    ID::get_name_abi_cxx11_((ID *)local_30);
    Exception::Exception(this_01,"Parser error: use of undeclared ID: ",(string *)local_30);
    __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void Parser::check_id() {
    if ( !(ID_tables_vec[c_add_val][c_val].get_declared()) )
        throw Exception("Parser error: use of undeclared ID: ", ID_tables_vec[c_add_val][c_val].get_name());
}